

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O1

void __thiscall
TEST_JUnitOutputTest_withOneTestGroupAndOneTestOnlyWriteToOneFile_Test::testBody
          (TEST_JUnitOutputTest_withOneTestGroupAndOneTestOnlyWriteToOneFile_Test *this)

{
  JUnitTestOutputTestRunner *pJVar1;
  UtestShell *pUVar2;
  FileSystemForJUnitTestOutputTests FVar3;
  TestTerminator *pTVar4;
  FileForJUnitOutputTests *pFVar5;
  long lVar6;
  
  pJVar1 = (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).testCaseRunner;
  TestResult::testsStarted(&pJVar1->result_);
  JUnitTestOutputTestRunner::runPreviousTest(pJVar1);
  JUnitTestOutputTestRunner::endOfPreviousTestGroup(pJVar1);
  pJVar1->currentGroupName_ = "groupname";
  pJVar1 = JUnitTestOutputTestRunner::withTest(pJVar1,"testname");
  JUnitTestOutputTestRunner::end(pJVar1);
  pUVar2 = UtestShell::getCurrent();
  lVar6 = 0;
  for (FVar3 = fileSystem; FVar3.firstFile_ != (FileForJUnitOutputTests *)0x0;
      FVar3.firstFile_ = (FVar3.firstFile_)->next_) {
    lVar6 = lVar6 + 1;
  }
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,1,lVar6,"LONGS_EQUAL(1, fileSystem.amountOfFiles()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
             ,0x16c,pTVar4);
  pUVar2 = UtestShell::getCurrent();
  pFVar5 = FileSystemForJUnitTestOutputTests::file(&fileSystem,"cpputest_groupname.xml");
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(pFVar5 != (FileForJUnitOutputTests *)0x0),"CHECK",
             "fileSystem.fileExists(\"cpputest_groupname.xml\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
             ,0x16d,pTVar4);
  return;
}

Assistant:

TEST(JUnitOutputTest, withOneTestGroupAndOneTestOnlyWriteToOneFile)
{
    testCaseRunner->start()
            .withGroup("groupname").withTest("testname")
            .end();

    LONGS_EQUAL(1, fileSystem.amountOfFiles());
    CHECK(fileSystem.fileExists("cpputest_groupname.xml"));
}